

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

int Matvec_SparseCSR(SUNMatrix A,N_Vector x,N_Vector y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  realtype *prVar4;
  realtype *prVar5;
  realtype *yd;
  realtype *xd;
  realtype *Ax;
  sunindextype *Aj;
  sunindextype *Ap;
  sunindextype j;
  sunindextype i;
  N_Vector y_local;
  N_Vector x_local;
  SUNMatrix A_local;
  
  lVar1 = *(long *)((long)A->content + 0x38);
  lVar2 = *(long *)((long)A->content + 0x30);
  lVar3 = *(long *)((long)A->content + 0x20);
  if (((lVar1 == 0) || (lVar2 == 0)) || (lVar3 == 0)) {
    A_local._4_4_ = 1;
  }
  else {
    prVar4 = N_VGetArrayPointer(x);
    prVar5 = N_VGetArrayPointer(y);
    if (((prVar4 == (realtype *)0x0) || (prVar5 == (realtype *)0x0)) || (prVar4 == prVar5)) {
      A_local._4_4_ = 1;
    }
    else {
      for (j = 0; j < *A->content; j = j + 1) {
        prVar5[j] = 0.0;
      }
      for (j = 0; j < *A->content; j = j + 1) {
        for (Ap = *(sunindextype **)(lVar1 + j * 8); (long)Ap < *(long *)(lVar1 + 8 + j * 8);
            Ap = (sunindextype *)((long)Ap + 1)) {
          prVar5[j] = *(double *)(lVar3 + (long)Ap * 8) * prVar4[*(long *)(lVar2 + (long)Ap * 8)] +
                      prVar5[j];
        }
      }
      A_local._4_4_ = 0;
    }
  }
  return A_local._4_4_;
}

Assistant:

int Matvec_SparseCSR(SUNMatrix A, N_Vector x, N_Vector y)
{
  sunindextype i, j;
  sunindextype *Ap, *Aj;
  realtype *Ax, *xd, *yd;

  /* access data from CSR structure (return if failure) */
  Ap = SM_INDEXPTRS_S(A);
  Aj = SM_INDEXVALS_S(A);
  Ax = SM_DATA_S(A);
  if ((Ap == NULL) || (Aj == NULL) || (Ax == NULL))
    return 1;

  /* access vector data (return if failure) */
  xd = N_VGetArrayPointer(x);
  yd = N_VGetArrayPointer(y);
  if ((xd == NULL) || (yd == NULL) || (xd == yd))
    return 1;

  /* initialize result */
  for (i=0; i<SM_ROWS_S(A); i++)
    yd[i] = 0.0;

  /* iterate through matrix rows */
  for (i=0; i<SM_ROWS_S(A); i++) {

    /* iterate along row of A, performing product */
    for (j=Ap[i]; j<Ap[i+1]; j++)
      yd[i] += Ax[j]*xd[Aj[j]];

  }

  return(0);
}